

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcOpAlg.c
# Opt level: O1

int Mvc_CoverAlgebraicEqual(Mvc_Cover_t *pCover1,Mvc_Cover_t *pCover2)

{
  Mvc_Cube_t *pMVar1;
  int iVar2;
  Mvc_Cube_t *pMVar3;
  uint uVar4;
  Mvc_Cube_t *pMVar5;
  uint uVar6;
  bool bVar7;
  
  if (pCover1->nBits != pCover2->nBits) {
    __assert_fail("pCover1->nBits == pCover2->nBits",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/mvc/mvcOpAlg.c"
                  ,0x8d,"int Mvc_CoverAlgebraicEqual(Mvc_Cover_t *, Mvc_Cover_t *)");
  }
  pMVar3 = (pCover1->lCubes).pHead;
  iVar2 = 1;
  if (pMVar3 != (Mvc_Cube_t *)0x0) {
    pMVar1 = (pCover2->lCubes).pHead;
    if (pMVar1 != (Mvc_Cube_t *)0x0) {
LAB_004229fa:
      uVar4 = *(uint *)&pMVar3->field_0x8 & 0xffffff;
      pMVar5 = pMVar1;
      do {
        if (uVar4 == 0) {
          bVar7 = pMVar3->pData[0] == pMVar5->pData[0];
LAB_00422a47:
          if (bVar7) goto LAB_00422a5a;
        }
        else {
          uVar6 = uVar4;
          if (uVar4 == 1) {
            if (pMVar3->pData[0] == pMVar5->pData[0]) {
              bVar7 = *(int *)&pMVar3->field_0x14 == *(int *)&pMVar5->field_0x14;
              goto LAB_00422a47;
            }
          }
          else {
            while (pMVar3->pData[uVar6] == pMVar5->pData[uVar6]) {
              bVar7 = (int)uVar6 < 1;
              uVar6 = uVar6 - 1;
              if (bVar7) goto LAB_00422a5a;
            }
          }
        }
        pMVar5 = pMVar5->pNext;
        if (pMVar5 == (Mvc_Cube_t *)0x0) break;
      } while( true );
    }
    iVar2 = 0;
  }
  return iVar2;
LAB_00422a5a:
  pMVar3 = pMVar3->pNext;
  if (pMVar3 == (Mvc_Cube_t *)0x0) {
    return 1;
  }
  goto LAB_004229fa;
}

Assistant:

int Mvc_CoverAlgebraicEqual( Mvc_Cover_t * pCover1, Mvc_Cover_t * pCover2 )
{
    Mvc_Cube_t * pCube1, * pCube2;
    int fFound;
    int CompResult;

    // covers should be the same base
    assert( pCover1->nBits == pCover2->nBits );
    // iterate through the cubes
    Mvc_CoverForEachCube( pCover1, pCube1 )
    {
        fFound = 0;
        Mvc_CoverForEachCube( pCover2, pCube2 )
        {
            Mvc_CubeBitEqual( CompResult, pCube1, pCube2 );
            if ( CompResult )
            {
                fFound = 1;
                break;
            }
        }
        if ( !fFound )
            return 0;
    }
    return 1;
}